

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O0

void OpenSteer::drawCircleOrDisk
               (float radius,Vec3 *axis,Vec3 *center,Color *color,int segments,bool filled,bool in3d
               )

{
  PFNGLCOLOR3FPROC p_Var1;
  int in_ECX;
  uint uVar2;
  Color *in_RDX;
  void *extraout_RDX;
  undefined8 *in_RSI;
  char *in_RDI;
  uint in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  GLfloat extraout_XMM0_Da;
  float fVar3;
  float fVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Vec3 VVar5;
  Vec3 VVar6;
  int i;
  int vertexCount;
  float cos;
  float sin;
  float step;
  Vec3 pointOnCircle;
  Vec3 unitPerp;
  Vec3 unitAxis;
  LocalSpace ls;
  int in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc48 [16];
  float in_stack_fffffffffffffc5c;
  undefined4 in_stack_fffffffffffffc60;
  float in_stack_fffffffffffffc64;
  undefined1 in_stack_fffffffffffffc68 [16];
  Vec3 *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  float in_stack_fffffffffffffc84;
  int local_340;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  Vec3 local_210;
  undefined8 local_200;
  float local_1f8;
  undefined8 local_1f0;
  float local_1e8;
  undefined8 local_1dc;
  float local_1d4;
  int local_1d0;
  int local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined8 local_1c0;
  float local_1b8;
  undefined8 local_1ac;
  float local_1a4;
  float local_1a0;
  Vec3 local_19c;
  undefined8 local_190;
  float local_188;
  undefined8 local_180;
  float local_178;
  undefined8 local_170;
  uint local_168;
  undefined8 local_160;
  uint local_158;
  undefined8 local_150;
  float local_148;
  undefined8 local_140;
  float local_138;
  undefined8 local_130;
  float local_128;
  undefined8 local_120;
  float local_118;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  float local_f8;
  undefined8 local_f0;
  float local_e8;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  undefined8 local_90;
  float local_88;
  undefined8 local_70;
  float local_68;
  LocalSpaceMixin<OpenSteer::AbstractLocalSpace> local_60;
  byte local_26;
  byte local_25;
  int local_24;
  Color *local_20;
  undefined8 *local_18;
  float local_4;
  
  VVar6 = in_stack_fffffffffffffc68._0_12_;
  uVar2 = in_R8D & 0xffffff01;
  local_25 = (byte)uVar2;
  local_26 = (byte)in_R9D & 1;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_4 = in_XMM0_Da;
  LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::LocalSpaceMixin(in_stack_fffffffffffffc48._8_8_);
  if ((local_26 & 1) != 0) {
    VVar5 = Vec3::normalize((Vec3 *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
    local_88 = VVar5.z;
    local_90 = VVar5._0_8_;
    local_70 = local_90;
    local_68 = local_88;
    VVar5 = findPerpendicularIn3d
                      ((Vec3 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    local_b8 = VVar5.z;
    local_c0 = VVar5._0_8_;
    local_b0 = local_c0;
    local_a8 = local_b8;
    VVar5 = Vec3::normalize((Vec3 *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
    local_c8 = VVar5.z;
    local_d0 = VVar5._0_8_;
    local_d8 = local_68;
    local_e0 = local_70;
    local_e8 = local_68;
    local_f0 = local_70;
    local_a0 = local_d0;
    local_98 = local_c8;
    VVar5 = LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::setUp
                      (in_stack_fffffffffffffc48._8_8_,VVar6);
    local_108 = VVar5.z;
    local_110 = VVar5._0_8_;
    local_118 = local_98;
    local_120 = local_a0;
    local_128 = local_98;
    local_130 = local_a0;
    local_100 = local_110;
    local_f8 = local_108;
    VVar5 = LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::setForward
                      (in_stack_fffffffffffffc48._8_8_,VVar6);
    local_148 = VVar5.z;
    local_150 = VVar5._0_8_;
    uVar2 = *(uint *)(local_18 + 1);
    local_170 = *local_18;
    local_168 = uVar2;
    local_160 = local_170;
    local_158 = uVar2;
    local_140 = local_150;
    local_138 = local_148;
    VVar6 = LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::setPosition
                      (in_stack_fffffffffffffc48._8_8_,VVar6);
    local_188 = VVar6.z;
    local_190 = VVar6._0_8_;
    local_180 = local_190;
    local_178 = local_188;
    LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::setUnitSideFromForwardAndUp
              ((LocalSpaceMixin<OpenSteer::AbstractLocalSpace> *)
               CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  }
  if ((local_25 & 1) != 0) {
    anon_unknown.dwarf_1485b::beginDoubleSidedDrawing();
  }
  Vec3::Vec3(&local_19c,local_4,0.0,0.0);
  p_Var1 = glad_glColor3f;
  local_1a0 = 6.2831855 / (float)local_24;
  Color::r(local_20,in_RDX,extraout_RDX,uVar2,in_RDI,in_R9D,in_stack_fffffffffffffc38);
  fVar3 = Color::g(local_20);
  fVar4 = Color::b(local_20);
  (*p_Var1)(extraout_XMM0_Da,fVar3,fVar4);
  (*glad_glBegin)((local_25 & 1) * 4 + 2);
  if ((local_25 & 1) != 0) {
    if ((local_26 & 1) == 0) {
      local_1ac = *local_18;
      local_1a4 = *(float *)(local_18 + 1);
    }
    else {
      VVar6 = LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::position(&local_60);
      local_1b8 = VVar6.z;
      local_1c0 = VVar6._0_8_;
      local_1ac = local_1c0;
      local_1a4 = local_1b8;
    }
    anon_unknown.dwarf_1485b::iglVertexVec3((Vec3 *)0x11a6c5);
  }
  local_1c4 = 0;
  local_1c8 = 0;
  if ((local_25 & 1) == 0) {
    local_340 = local_24;
  }
  else {
    local_340 = local_24 + 1;
  }
  local_1cc = local_340;
  for (local_1d0 = 0; local_1d0 < local_1cc; local_1d0 = local_1d0 + 1) {
    if ((local_26 & 1) == 0) {
      VVar6 = Vec3::operator+(in_stack_fffffffffffffc48._8_8_,in_stack_fffffffffffffc48._0_8_);
      in_stack_fffffffffffffc84 = VVar6.z;
      local_200 = VVar6._0_8_;
      local_1f8 = in_stack_fffffffffffffc84;
      local_1dc = local_200;
      local_1d4 = in_stack_fffffffffffffc84;
    }
    else {
      VVar6 = LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::globalizePosition
                        ((LocalSpaceMixin<OpenSteer::AbstractLocalSpace> *)
                         CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                         in_stack_fffffffffffffc78);
      local_1e8 = VVar6.z;
      local_1f0 = VVar6._0_8_;
      local_1dc = local_1f0;
      local_1d4 = local_1e8;
    }
    anon_unknown.dwarf_1485b::iglVertexVec3((Vec3 *)0x11a80c);
    VVar6 = Vec3::rotateAboutGlobalY
                      ((Vec3 *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                       in_stack_fffffffffffffc5c,in_stack_fffffffffffffc48._8_8_,
                       in_stack_fffffffffffffc48._0_8_);
    in_stack_fffffffffffffc64 = VVar6.z;
    local_210._0_8_ = VVar6._0_8_;
    local_210.z = in_stack_fffffffffffffc64;
    VVar6 = Vec3::operator=(&local_19c,&local_210);
    in_stack_fffffffffffffc48._8_4_ = extraout_XMM0_Dc;
    in_stack_fffffffffffffc48._0_8_ = VVar6._0_8_;
    in_stack_fffffffffffffc48._12_4_ = extraout_XMM0_Dd;
  }
  (*glad_glEnd)();
  if ((local_25 & 1) != 0) {
    anon_unknown.dwarf_1485b::endDoubleSidedDrawing();
  }
  LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::~LocalSpaceMixin
            ((LocalSpaceMixin<OpenSteer::AbstractLocalSpace> *)0x11a91d);
  return;
}

Assistant:

void 
OpenSteer::drawCircleOrDisk (const float radius,
                             const Vec3& axis,
                             const Vec3& center,
                             const Color& color,
                             const int segments,
                             const bool filled,
                             const bool in3d)
{
    LocalSpace ls;
    if (in3d)
    {
        // define a local space with "axis" as the Y/up direction
        // (XXX should this be a method on  LocalSpace?)
        const Vec3 unitAxis = axis.normalize ();
        const Vec3 unitPerp = findPerpendicularIn3d (axis).normalize ();
        ls.setUp (unitAxis);
        ls.setForward (unitPerp);
        ls.setPosition (center);
        ls.setUnitSideFromForwardAndUp ();
    }
        
    // make disks visible (not culled) from both sides 
    if (filled) beginDoubleSidedDrawing ();

    // point to be rotated about the (local) Y axis, angular step size
    Vec3 pointOnCircle (radius, 0, 0);
    const float step = (2 * OPENSTEER_M_PI) / segments;

    // set drawing color
    glColor3f (color.r(), color.g(), color.b());

    // begin drawing a triangle fan (for disk) or line loop (for circle)
    glBegin (filled ? GL_TRIANGLE_FAN : GL_LINE_LOOP);

    // for the filled case, first emit the center point
    if (filled) iglVertexVec3 (in3d ? ls.position() : center);

    // rotate p around the circle in "segments" steps
    float sin=0, cos=0;
    const int vertexCount = filled ? segments+1 : segments;
    for (int i = 0; i < vertexCount; i++)
    {
        // emit next point on circle, either in 3d (globalized out
        // of the local space), or in 2d (offset from the center)
        iglVertexVec3 (in3d ?
                           ls.globalizePosition (pointOnCircle) :
                           (Vec3) (pointOnCircle + center));

        // rotate point one more step around circle
        pointOnCircle = pointOnCircle.rotateAboutGlobalY (step, sin, cos);
    }

    // close drawing operation
    glEnd ();
    if (filled) endDoubleSidedDrawing ();
}